

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O3

duckdb_value duckdb_get_map_key(duckdb_value value,idx_t index)

{
  vector<duckdb::Value,_true> *pvVar1;
  const_reference pvVar2;
  Value *this;
  Value val;
  Value local_50;
  
  if (value != (duckdb_value)0x0) {
    duckdb::Value::Value(&local_50,(Value *)value);
    if (((local_50.type_.id_ == MAP) && (local_50.is_null == false)) &&
       (pvVar1 = duckdb::MapValue::GetChildren(&local_50),
       index < (ulong)((long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar1->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 6))) {
      pvVar2 = duckdb::vector<duckdb::Value,_true>::operator[](pvVar1,index);
      pvVar1 = duckdb::StructValue::GetChildren(pvVar2);
      this = (Value *)operator_new(0x40);
      pvVar2 = duckdb::vector<duckdb::Value,_true>::operator[](pvVar1,0);
      duckdb::Value::Value(this,pvVar2);
    }
    else {
      this = (Value *)0x0;
    }
    duckdb::Value::~Value(&local_50);
    return (duckdb_value)this;
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_get_map_key(duckdb_value value, idx_t index) {
	if (!value) {
		return nullptr;
	}

	auto val = UnwrapValue(value);
	if (val.type().id() != LogicalTypeId::MAP || val.IsNull()) {
		return nullptr;
	}

	auto &children = duckdb::MapValue::GetChildren(val);
	if (index >= children.size()) {
		return nullptr;
	}

	auto &child = children[index];
	auto &child_struct = duckdb::StructValue::GetChildren(child);
	return WrapValue(new duckdb::Value(child_struct[0]));
}